

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsharedpointer_impl.h
# Opt level: O1

void QSharedPointer<QFileDialogOptions>::deref(Data *dd)

{
  Data *pDVar1;
  
  if (dd != (Data *)0x0) {
    LOCK();
    pDVar1 = dd + 4;
    *(int *)pDVar1 = *(int *)pDVar1 + -1;
    UNLOCK();
    if (*(int *)pDVar1 == 0) {
      (**(code **)(dd + 8))(dd);
    }
    LOCK();
    *(int *)dd = *(int *)dd + -1;
    UNLOCK();
    if (*(int *)dd == 0) {
      operator_delete(dd);
      return;
    }
  }
  return;
}

Assistant:

static void deref(Data *dd) noexcept
    {
        if (!dd) return;
        if (!dd->strongref.deref()) {
            dd->destroy();
        }
        if (!dd->weakref.deref())
            delete dd;
    }